

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

void __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Vertex>::~Pool
          (Pool<btConvexHullInternal::Vertex> *this)

{
  long *in_RDI;
  PoolArray<btConvexHullInternal::Vertex> *p;
  
  while (*in_RDI != 0) {
    *in_RDI = *(long *)(*in_RDI + 0x10);
    PoolArray<btConvexHullInternal::Vertex>::~PoolArray
              ((PoolArray<btConvexHullInternal::Vertex> *)0x15343e);
    btAlignedFreeInternal((void *)0x153448);
  }
  return;
}

Assistant:

~Pool()
				{
					while (arrays)
					{
						PoolArray<T>* p = arrays;
						arrays = p->next;
						p->~PoolArray<T>();
						btAlignedFree(p);
					}
				}